

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O1

void poly2_reverse_700(poly2 *out,poly2 *in)

{
  ulong uVar1;
  size_t i_1;
  long lVar2;
  byte bVar3;
  crypto_word_t *pcVar4;
  size_t i;
  long lVar5;
  ulong *puVar6;
  crypto_word_t cVar7;
  ulong auStack_70 [3];
  poly2 t;
  
  lVar5 = 0;
  do {
    cVar7 = in->v[lVar5];
    puVar6 = &word_reverse(unsigned_long)::kMasks;
    lVar2 = 0;
    do {
      bVar3 = (byte)(1 << ((byte)lVar2 & 0x1f));
      cVar7 = (*puVar6 & cVar7) << (bVar3 & 0x3f) | cVar7 >> (bVar3 & 0x3f) & *puVar6;
      lVar2 = lVar2 + 1;
      puVar6 = puVar6 + 1;
    } while (lVar2 != 6);
    auStack_70[lVar5 + 1] = cVar7;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xb);
  lVar5 = 10;
  pcVar4 = out->v;
  do {
    uVar1 = auStack_70[lVar5 + 1];
    *pcVar4 = uVar1 >> 4;
    *pcVar4 = auStack_70[lVar5] << 0x3c | uVar1 >> 4;
    pcVar4 = pcVar4 + 1;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  out->v[10] = auStack_70[1] >> 4;
  return;
}

Assistant:

static void poly2_reverse_700(struct poly2 *out, const struct poly2 *in) {
  struct poly2 t;
  for (size_t i = 0; i < WORDS_PER_POLY; i++) {
    t.v[i] = word_reverse(in->v[i]);
  }

  static const size_t shift = BITS_PER_WORD - ((N - 1) % BITS_PER_WORD);
  for (size_t i = 0; i < WORDS_PER_POLY - 1; i++) {
    out->v[i] = t.v[WORDS_PER_POLY - 1 - i] >> shift;
    out->v[i] |= t.v[WORDS_PER_POLY - 2 - i] << (BITS_PER_WORD - shift);
  }
  out->v[WORDS_PER_POLY - 1] = t.v[0] >> shift;
}